

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O2

Index anurbs::Nurbs::upper_bound<std::vector<double,std::allocator<double>>>
                (vector<double,_std::allocator<double>_> *values,Index first,Index last,double value
                )

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = last - first;
  while (uVar2 = uVar1, 0 < (long)uVar2) {
    uVar1 = uVar2 >> 1;
    if ((values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[first + uVar1] <= value) {
      first = first + uVar1 + 1;
      uVar1 = ~uVar1 + uVar2;
    }
  }
  return first;
}

Assistant:

static Index upper_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (!(value < values[i])) {
                first = ++i;
                count -= step + 1;
            } else {
                count = step;
            }
        }
        return first;
    }